

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

void __thiscall StrTest_Convert_Test::TestBody(StrTest_Convert_Test *this)

{
  char *pcVar1;
  AssertHelper local_48;
  AssertionResult gtest_ar;
  AssertHelper local_30;
  string s;
  
  local_48.data_._0_4_ = 0x2a;
  str<int>(&s,(int *)&local_48);
  testing::internal::CmpHelperEQ<char[3],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"42\"","str(42)",(char (*) [3])0x1f1bef,&s);
  std::__cxx11::string::~string((string *)&s);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&s);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x72e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&s);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&s);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0xc000007;
  gtest_ar.message_.ptr_._0_4_ = 9;
  str<Date>(&s,(Date *)&gtest_ar);
  testing::internal::CmpHelperEQ<char[10],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"2012-12-9\"","s",(char (*) [10])"2012-12-9",&s);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_48);
    if ((undefined8 *)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_) ==
        (undefined8 *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)CONCAT44(gtest_ar.message_.ptr_._4_4_,gtest_ar.message_.ptr_._0_4_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x730,pcVar1);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

TEST(StrTest, Convert) {
  EXPECT_EQ("42", str(42));
  std::string s = str(Date(2012, 12, 9));
  EXPECT_EQ("2012-12-9", s);
}